

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::SymbolMatcher::SymbolMatcher
          (SymbolMatcher *this,UnicodeString *symbolString,Key key)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  Key key_local;
  UnicodeString *symbolString_local;
  SymbolMatcher *this_local;
  
  NumberParseMatcher::NumberParseMatcher(&this->super_NumberParseMatcher);
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_005bf568;
  icu_63::UnicodeString::UnicodeString(&this->fString);
  pUVar2 = unisets::get(key);
  this->fUniSet = pUVar2;
  UVar1 = UnicodeSet::contains(this->fUniSet,symbolString);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->fString,symbolString);
  }
  else {
    icu_63::UnicodeString::setToBogus(&this->fString);
  }
  return;
}

Assistant:

SymbolMatcher::SymbolMatcher(const UnicodeString& symbolString, unisets::Key key) {
    fUniSet = unisets::get(key);
    if (fUniSet->contains(symbolString)) {
        fString.setToBogus();
    } else {
        fString = symbolString;
    }
}